

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_genparams_from_file.hpp
# Opt level: O1

void __thiscall
iutest::detail::iuCsvFileParamsGenerator<int>::AppendParams
          (iuCsvFileParamsGenerator<int> *this,params_t *params,string *data)

{
  byte bVar1;
  iterator __position;
  byte *pbVar2;
  byte *pbVar3;
  bool bVar4;
  int param;
  int local_c;
  
  bVar4 = data->_M_string_length == 0;
  if (!bVar4) {
    pbVar3 = (byte *)(data->_M_dataplus)._M_p;
    pbVar2 = pbVar3 + data->_M_string_length;
    do {
      bVar1 = *pbVar3;
      if (((ulong)bVar1 < 0x21) && ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
        pbVar3 = pbVar3 + 1;
      }
    } while (((bVar1 < 0x21) && ((0x100002600U >> ((ulong)(uint)bVar1 & 0x3f) & 1) != 0)) &&
            (bVar4 = pbVar3 == pbVar2, !bVar4));
  }
  if (!bVar4) {
    bVar4 = StringToValue<int>(data,&local_c);
    if (bVar4) {
      __position._M_current =
           (params->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
      if (__position._M_current ==
          (params->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)params,__position,&local_c);
      }
      else {
        *__position._M_current = local_c;
        (params->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_finish = __position._M_current + 1;
      }
    }
  }
  return;
}

Assistant:

void AppendParams(params_t& params, const ::std::string& data)
    {
        if( StringIsBlank(data) )
        {
            return;
        }
        T param;
        if( !StringToValue(data, param) )
        {
            return;
        }
        params.push_back(param);
    }